

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

BVSparse<Memory::JitArenaAllocator> * __thiscall
BackwardPass::ProcessByteCodeUsesSrcs(BackwardPass *this,ByteCodeUsesInstr *byteCodeUsesInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BVSparse<Memory::JitArenaAllocator> *bv2;
  
  bVar2 = DoByteCodeUpwardExposedUsed(this);
  if ((!bVar2) && (this->tag != BackwardPhase)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x7ea,"(this->DoByteCodeUpwardExposedUsed() || tag == Js::BackwardPhase)",
                       "this->DoByteCodeUpwardExposedUsed() || tag == Js::BackwardPhase");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bv2 = IR::ByteCodeUsesInstr::GetByteCodeUpwardExposedUsed(byteCodeUsesInstr);
  if (bv2 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bVar2 = DoByteCodeUpwardExposedUsed(this);
    if (bVar2) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->currentBlock->byteCodeUpwardExposedUsed,bv2);
    }
  }
  return bv2;
}

Assistant:

const BVSparse<JitArenaAllocator>*
BackwardPass::ProcessByteCodeUsesSrcs(IR::ByteCodeUsesInstr * byteCodeUsesInstr)
{
    Assert(this->DoByteCodeUpwardExposedUsed() || tag == Js::BackwardPhase);
    const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = byteCodeUsesInstr->GetByteCodeUpwardExposedUsed();
    if (byteCodeUpwardExposedUsed && this->DoByteCodeUpwardExposedUsed())
    {
        this->currentBlock->byteCodeUpwardExposedUsed->Or(byteCodeUpwardExposedUsed);
    }
    return byteCodeUpwardExposedUsed;
}